

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opacity.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  nk_rect nVar2;
  float local_5c;
  float fStack_58;
  float opacity;
  undefined8 uStack_50;
  float fStack_48;
  float fStack_44;
  nk_rect area;
  int height;
  int width;
  nk_font_atlas *atlas;
  nk_context *nk;
  GLFWwindow *window;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  window = (GLFWwindow *)argv;
  argv_local._0_4_ = argc;
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  glfwWindowHint(0x2200c,1);
  nk = (nk_context *)glfwCreateWindow(400,400,"Opacity",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (nk == (nk_context *)0x0) {
    glfwTerminate();
    exit(1);
  }
  glfwMakeContextCurrent((GLFWwindow *)nk);
  gladLoadGL(glfwGetProcAddress);
  glfwSwapInterval(1);
  atlas = (nk_font_atlas *)nk_glfw3_init((GLFWwindow *)nk,NK_GLFW3_INSTALL_CALLBACKS);
  nk_glfw3_font_stash_begin((nk_font_atlas **)&height);
  nk_glfw3_font_stash_end();
  while( true ) {
    iVar1 = glfwWindowShouldClose((GLFWwindow *)nk);
    if (iVar1 != 0) break;
    glfwGetWindowSize((GLFWwindow *)nk,(int *)&area.h,(int *)&area.w);
    nVar2 = nk_rect(0.0,0.0,(float)(int)area.h,(float)(int)area.w);
    fStack_58 = nVar2.x;
    opacity = nVar2.y;
    uStack_50._0_4_ = nVar2.w;
    uStack_50._4_4_ = nVar2.h;
    fStack_48 = fStack_58;
    fStack_44 = opacity;
    area.x = (float)uStack_50;
    area.y = uStack_50._4_4_;
    _fStack_58 = nVar2._0_8_;
    uStack_50 = nVar2._8_8_;
    (*glad_glClear)(0x4000);
    nk_glfw3_new_frame();
    nVar2.y = fStack_44;
    nVar2.x = fStack_48;
    nVar2.w = area.x;
    nVar2.h = area.y;
    iVar1 = nk_begin((nk_context *)atlas,"",nVar2,0);
    if (iVar1 != 0) {
      local_5c = glfwGetWindowOpacity((GLFWwindow *)nk);
      nk_layout_row_dynamic((nk_context *)atlas,30.0,2);
      iVar1 = nk_slider_float((nk_context *)atlas,0.0,&local_5c,1.0,0.001);
      if (iVar1 != 0) {
        glfwSetWindowOpacity((GLFWwindow *)nk,local_5c);
      }
      nk_labelf((nk_context *)atlas,0x11,"%0.3f",SUB84((double)local_5c,0));
    }
    nk_end((nk_context *)atlas);
    nk_glfw3_render(NK_ANTI_ALIASING_ON);
    glfwSwapBuffers((GLFWwindow *)nk);
    glfwWaitEventsTimeout(1.0);
  }
  nk_glfw3_shutdown();
  glfwTerminate();
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
    GLFWwindow* window;
    struct nk_context* nk;
    struct nk_font_atlas* atlas;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_SCALE_TO_MONITOR, GLFW_TRUE);

    window = glfwCreateWindow(400, 400, "Opacity", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);
    glfwSwapInterval(1);

    nk = nk_glfw3_init(window, NK_GLFW3_INSTALL_CALLBACKS);
    nk_glfw3_font_stash_begin(&atlas);
    nk_glfw3_font_stash_end();

    while (!glfwWindowShouldClose(window))
    {
        int width, height;
        struct nk_rect area;

        glfwGetWindowSize(window, &width, &height);
        area = nk_rect(0.f, 0.f, (float) width, (float) height);

        glClear(GL_COLOR_BUFFER_BIT);
        nk_glfw3_new_frame();
        if (nk_begin(nk, "", area, 0))
        {
            float opacity = glfwGetWindowOpacity(window);
            nk_layout_row_dynamic(nk, 30, 2);
            if (nk_slider_float(nk, 0.f, &opacity, 1.f, 0.001f))
                glfwSetWindowOpacity(window, opacity);
            nk_labelf(nk, NK_TEXT_LEFT, "%0.3f", opacity);
        }

        nk_end(nk);
        nk_glfw3_render(NK_ANTI_ALIASING_ON);

        glfwSwapBuffers(window);
        glfwWaitEventsTimeout(1.0);
    }

    nk_glfw3_shutdown();
    glfwTerminate();
    exit(EXIT_SUCCESS);
}